

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O3

void general_hash_test(PCryptoHashType type,psize hash_len,pchar *msg1,pchar *msg2,puchar *etalon1,
                      puchar *etalon2,puchar *etalon3,pchar *hash1,pchar *hash2,pchar *hash3,
                      pchar *hash_stress)

{
  undefined1 auVar1 [16];
  pchar *__s;
  PCryptoHashType PVar2;
  int iVar3;
  undefined8 uVar4;
  psize pVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar16;
  short sVar17;
  short sVar19;
  short sVar21;
  short sVar23;
  short sVar25;
  short sVar27;
  short sVar29;
  short sVar31;
  short sVar32;
  short sVar34;
  short sVar36;
  short sVar38;
  short sVar40;
  short sVar42;
  short sVar44;
  psize dig_len;
  psize local_58;
  pchar *local_50;
  long local_48;
  puchar *local_40;
  puchar *local_38;
  short sVar18;
  short sVar20;
  short sVar22;
  short sVar24;
  short sVar26;
  short sVar28;
  short sVar30;
  short sVar33;
  short sVar35;
  short sVar37;
  short sVar39;
  short sVar41;
  short sVar43;
  short sVar45;
  
  local_40 = etalon1;
  local_38 = etalon2;
  uVar4 = p_crypto_hash_new();
  pVar5 = p_crypto_hash_get_length(uVar4);
  if (pVar5 == hash_len) {
    PVar2 = p_crypto_hash_get_type(uVar4);
    if (PVar2 == type) {
      lVar6 = p_crypto_hash_get_string(uVar4);
      if (lVar6 == 0) {
        uVar4 = 0x4f;
      }
      else {
        p_crypto_hash_reset(uVar4);
        p_free(lVar6);
        lVar6 = p_malloc0(hash_len);
        if (lVar6 == 0) {
          uVar4 = 0x54;
        }
        else {
          local_48 = p_malloc0(10000);
          auVar1 = _DAT_00103030;
          if (local_48 != 0) {
            lVar10 = 0;
            auVar13 = _DAT_00103010;
            auVar14 = _DAT_00103020;
            do {
              auVar15 = pmulhuw(auVar14,auVar1);
              sVar16 = auVar14._0_2_ + (auVar15._0_2_ >> 4) * -0x14;
              sVar18 = auVar14._2_2_;
              sVar17 = sVar18 + (auVar15._2_2_ >> 4) * -0x14;
              sVar20 = auVar14._4_2_;
              sVar19 = sVar20 + (auVar15._4_2_ >> 4) * -0x14;
              sVar22 = auVar14._6_2_;
              sVar21 = sVar22 + (auVar15._6_2_ >> 4) * -0x14;
              sVar24 = auVar14._8_2_;
              sVar23 = sVar24 + (auVar15._8_2_ >> 4) * -0x14;
              sVar26 = auVar14._10_2_;
              sVar25 = sVar26 + (auVar15._10_2_ >> 4) * -0x14;
              sVar28 = auVar14._12_2_;
              sVar30 = auVar14._14_2_;
              sVar27 = sVar28 + (auVar15._12_2_ >> 4) * -0x14;
              sVar29 = sVar30 + (auVar15._14_2_ >> 4) * -0x14;
              auVar15 = pmulhuw(auVar13,auVar1);
              sVar31 = auVar13._0_2_ + (auVar15._0_2_ >> 4) * -0x14;
              sVar33 = auVar13._2_2_;
              sVar32 = sVar33 + (auVar15._2_2_ >> 4) * -0x14;
              sVar35 = auVar13._4_2_;
              sVar34 = sVar35 + (auVar15._4_2_ >> 4) * -0x14;
              sVar37 = auVar13._6_2_;
              sVar36 = sVar37 + (auVar15._6_2_ >> 4) * -0x14;
              sVar39 = auVar13._8_2_;
              sVar38 = sVar39 + (auVar15._8_2_ >> 4) * -0x14;
              sVar41 = auVar13._10_2_;
              sVar40 = sVar41 + (auVar15._10_2_ >> 4) * -0x14;
              sVar43 = auVar13._12_2_;
              sVar45 = auVar13._14_2_;
              sVar42 = sVar43 + (auVar15._12_2_ >> 4) * -0x14;
              sVar44 = sVar45 + (auVar15._14_2_ >> 4) * -0x14;
              pcVar8 = (char *)(local_48 + lVar10);
              *pcVar8 = ((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16)) + 'a';
              pcVar8[1] = ((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17)) + 'a';
              pcVar8[2] = ((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19)) + 'a';
              pcVar8[3] = ((0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21)) + 'a';
              pcVar8[4] = ((0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23)) + 'a';
              pcVar8[5] = ((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25)) + 'a';
              pcVar8[6] = ((0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27)) + 'a';
              pcVar8[7] = ((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29)) + 'a';
              pcVar8[8] = ((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31)) + 'a';
              pcVar8[9] = ((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32)) + 'a';
              pcVar8[10] = ((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34)) + 'a';
              pcVar8[0xb] = ((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36)) + 'a'
              ;
              pcVar8[0xc] = ((0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38)) + 'a'
              ;
              pcVar8[0xd] = ((0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40)) + 'a'
              ;
              pcVar8[0xe] = ((0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42)) + 'a'
              ;
              pcVar8[0xf] = ((0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44)) + 'a'
              ;
              lVar10 = lVar10 + 0x10;
              auVar14._0_2_ = auVar14._0_2_ + 0x10;
              auVar14._2_2_ = sVar18 + 0x10;
              auVar14._4_2_ = sVar20 + 0x10;
              auVar14._6_2_ = sVar22 + 0x10;
              auVar14._8_2_ = sVar24 + 0x10;
              auVar14._10_2_ = sVar26 + 0x10;
              auVar14._12_2_ = sVar28 + 0x10;
              auVar14._14_2_ = sVar30 + 0x10;
              auVar13._0_2_ = auVar13._0_2_ + 0x10;
              auVar13._2_2_ = sVar33 + 0x10;
              auVar13._4_2_ = sVar35 + 0x10;
              auVar13._6_2_ = sVar37 + 0x10;
              auVar13._8_2_ = sVar39 + 0x10;
              auVar13._10_2_ = sVar41 + 0x10;
              auVar13._12_2_ = sVar43 + 0x10;
              auVar13._14_2_ = sVar45 + 0x10;
            } while (lVar10 != 10000);
            local_50 = msg2;
            sVar7 = strlen(msg1);
            p_crypto_hash_update(uVar4,msg1,sVar7);
            pcVar8 = (char *)p_crypto_hash_get_string(uVar4);
            iVar3 = strcmp(pcVar8,hash1);
            if (iVar3 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x61);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            p_free(pcVar8);
            p_crypto_hash_reset(uVar4);
            local_58 = hash_len;
            sVar7 = strlen(msg1);
            p_crypto_hash_update(uVar4,msg1,sVar7);
            p_crypto_hash_get_digest(uVar4,lVar6,&local_58);
            if (local_58 != hash_len) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x6b);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            if (hash_len != 0) {
              uVar9 = 0;
              uVar11 = 1;
              do {
                if (*(puchar *)(lVar6 + uVar9) != local_40[uVar9]) {
                  printf("%s:%d: check failed\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                         ,0x6e);
                  p_atomic_int_inc(&p_test_module_fail_counter);
                }
                bVar12 = uVar11 < hash_len;
                uVar9 = uVar11;
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (bVar12);
            }
            p_crypto_hash_reset(uVar4);
            __s = local_50;
            sVar7 = strlen(local_50);
            p_crypto_hash_update(uVar4,__s,sVar7);
            pcVar8 = (char *)p_crypto_hash_get_string(uVar4);
            iVar3 = strcmp(pcVar8,hash2);
            if (iVar3 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x77);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            p_free(pcVar8);
            p_crypto_hash_reset(uVar4);
            local_58 = hash_len;
            sVar7 = strlen(__s);
            p_crypto_hash_update(uVar4,__s,sVar7);
            p_crypto_hash_get_digest(uVar4,lVar6,&local_58);
            if (local_58 != hash_len) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x81);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            if (hash_len != 0) {
              uVar9 = 0;
              uVar11 = 1;
              do {
                if (*(puchar *)(lVar6 + uVar9) != local_38[uVar9]) {
                  printf("%s:%d: check failed\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                         ,0x84);
                  p_atomic_int_inc(&p_test_module_fail_counter);
                }
                bVar12 = uVar11 < hash_len;
                uVar9 = uVar11;
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (bVar12);
            }
            p_crypto_hash_reset(uVar4);
            iVar3 = 1000000;
            do {
              p_crypto_hash_update(uVar4,"a",1);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            pcVar8 = (char *)p_crypto_hash_get_string(uVar4);
            iVar3 = strcmp(pcVar8,hash3);
            if (iVar3 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x90);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            p_free(pcVar8);
            p_crypto_hash_reset(uVar4);
            iVar3 = 1000000;
            local_58 = hash_len;
            do {
              p_crypto_hash_update(uVar4,"a",1);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            p_crypto_hash_get_digest(uVar4,lVar6,&local_58);
            if (local_58 != hash_len) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x9b);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            if (hash_len != 0) {
              uVar9 = 0;
              uVar11 = 1;
              do {
                if (*(puchar *)(lVar6 + uVar9) != etalon3[uVar9]) {
                  printf("%s:%d: check failed\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                         ,0x9e);
                  p_atomic_int_inc(&p_test_module_fail_counter);
                }
                bVar12 = uVar11 < hash_len;
                uVar9 = uVar11;
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (bVar12);
            }
            p_crypto_hash_reset(uVar4);
            lVar10 = local_48;
            p_crypto_hash_update(uVar4,local_48,10000);
            pcVar8 = (char *)p_crypto_hash_get_string(uVar4);
            iVar3 = strcmp(pcVar8,hash_stress);
            if (iVar3 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0xa6);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            p_free(pcVar8);
            p_crypto_hash_reset(uVar4);
            p_free(lVar10);
            p_free(lVar6);
            p_crypto_hash_free(uVar4);
            return;
          }
          uVar4 = 0x57;
        }
      }
    }
    else {
      uVar4 = 0x4c;
    }
  }
  else {
    uVar4 = 0x4b;
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
         ,uVar4);
  exit(-1);
}

Assistant:

static void
general_hash_test (PCryptoHashType	type,
		   psize		hash_len,
		   const pchar		*msg1,
		   const pchar		*msg2,
		   const puchar		*etalon1,
		   const puchar		*etalon2,
		   const puchar		*etalon3,
		   const pchar		*hash1,
		   const pchar		*hash2,
		   const pchar		*hash3,
		   const pchar		*hash_stress)
{
	PCryptoHash	*crypto_hash;
	psize		dig_len;
	pchar		*hash_str;
	pchar		*long_str;
	puchar		*hash_dig;

	crypto_hash = p_crypto_hash_new (type);

	P_TEST_REQUIRE ((psize) p_crypto_hash_get_length (crypto_hash) == hash_len);
	P_TEST_REQUIRE (p_crypto_hash_get_type (crypto_hash) == type);

	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_REQUIRE (hash_str != NULL);
	p_crypto_hash_reset (crypto_hash);
	p_free (hash_str);

	hash_dig = (puchar *) p_malloc0 (hash_len);
	P_TEST_REQUIRE (hash_dig != NULL);

	long_str = (pchar *) p_malloc0 (PCRYPTO_STRESS_LENGTH);
	P_TEST_REQUIRE (long_str != NULL);

	for (int i = 0; i < PCRYPTO_STRESS_LENGTH; ++i)
		long_str[i] = (pchar) (97 + i % 20);

	/* Case 1 */

	/* Check string */
	p_crypto_hash_update (crypto_hash, (const puchar *) msg1, strlen (msg1));
	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_CHECK (strcmp (hash_str, hash1) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	p_crypto_hash_update (crypto_hash, (const puchar *) msg1, strlen (msg1));
	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);

	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon1[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Case 2 */

	/* Check string */
	p_crypto_hash_update (crypto_hash, (const puchar *) msg2, strlen (msg2));
	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_CHECK (strcmp (hash_str, hash2) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	p_crypto_hash_update (crypto_hash, (const puchar *) msg2, strlen (msg2));
	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);

	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon2[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Case 3 */

	/* Check string */
	for (int i = 0; i < PCRYPTO_MAX_UPDATES; ++i)
		p_crypto_hash_update (crypto_hash, (const puchar *) "a", 1);

	hash_str = p_crypto_hash_get_string (crypto_hash);

	P_TEST_CHECK (strcmp (hash_str, hash3) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	for (int i = 0; i < PCRYPTO_MAX_UPDATES; ++i)
		p_crypto_hash_update (crypto_hash, (const puchar *) "a", 1);

	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);
	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon3[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Stress test */
	p_crypto_hash_update (crypto_hash, (const puchar *) long_str, PCRYPTO_STRESS_LENGTH);
	hash_str = p_crypto_hash_get_string (crypto_hash);

	P_TEST_CHECK (strcmp (hash_str, hash_stress) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	p_free (long_str);
	p_free (hash_dig);
	p_crypto_hash_free (crypto_hash);
}